

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL> *
__thiscall
spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::
get_extra_required_extension_names_abi_cxx11_
          (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
           *__return_storage_ptr__,ShaderSubgroupSupportHelper *this,Candidate c)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  string *local_138;
  string *local_f0;
  allocator local_c2;
  allocator local_c1;
  string *local_c0;
  string local_b8 [32];
  string local_98 [32];
  iterator local_78;
  undefined8 local_70;
  undefined1 local_65;
  allocator local_51;
  string *local_50;
  string local_48 [32];
  iterator local_28;
  undefined8 local_20;
  int local_14;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *pSStack_10;
  Candidate c_local;
  
  local_14 = (int)this;
  pSStack_10 = __return_storage_ptr__;
  if (local_14 == 6) {
    local_65 = 1;
    local_50 = local_48;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_48,"GL_ARB_shader_int64",&local_51);
    local_65 = 0;
    local_28 = (iterator)local_48;
    local_20 = 1;
    init_00._M_len = 1;
    init_00._M_array = local_28;
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::SmallVector(__return_storage_ptr__,init_00);
    local_f0 = (string *)&local_28;
    do {
      local_f0 = local_f0 + -0x20;
      ::std::__cxx11::string::~string(local_f0);
    } while (local_f0 != local_48);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  else if (local_14 == 8) {
    local_c0 = local_b8;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_b8,"GL_AMD_gpu_shader_int64",&local_c1);
    local_c0 = local_98;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_98,"GL_NV_gpu_shader5",&local_c2);
    local_78 = (iterator)local_b8;
    local_70 = 2;
    init._M_len = 2;
    init._M_array = local_78;
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::SmallVector(__return_storage_ptr__,init);
    local_138 = (string *)&local_78;
    do {
      local_138 = local_138 + -0x20;
      ::std::__cxx11::string::~string(local_138);
    } while (local_138 != local_b8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_c2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  else {
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::SmallVector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

SmallVector<std::string> CompilerGLSL::ShaderSubgroupSupportHelper::get_extra_required_extension_names(Candidate c)
{
	switch (c)
	{
	case ARB_shader_ballot:
		return { "GL_ARB_shader_int64" };
	case AMD_gcn_shader:
		return { "GL_AMD_gpu_shader_int64", "GL_NV_gpu_shader5" };
	default:
		return {};
	}
}